

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

void Abc_TtElemInit(word **pTtElems,int nVars)

{
  int iVar1;
  word wVar2;
  uint local_1c;
  int nWords;
  int k;
  int i;
  int nVars_local;
  word **pTtElems_local;
  
  iVar1 = Abc_TtWordNum(nVars);
  for (nWords = 0; nWords < nVars; nWords = nWords + 1) {
    if (nWords < 6) {
      for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
        pTtElems[nWords][(int)local_1c] = s_Truths6[nWords];
      }
    }
    else {
      for (local_1c = 0; (int)local_1c < iVar1; local_1c = local_1c + 1) {
        wVar2 = 0;
        if ((local_1c & 1 << ((char)nWords - 6U & 0x1f)) != 0) {
          wVar2 = 0xffffffffffffffff;
        }
        pTtElems[nWords][(int)local_1c] = wVar2;
      }
    }
  }
  return;
}

Assistant:

static inline void Abc_TtElemInit( word ** pTtElems, int nVars )
{
    int i, k, nWords = Abc_TtWordNum( nVars );
    for ( i = 0; i < nVars; i++ )
        if ( i < 6 )
            for ( k = 0; k < nWords; k++ )
                pTtElems[i][k] = s_Truths6[i];
        else
            for ( k = 0; k < nWords; k++ )
                pTtElems[i][k] = (k & (1 << (i-6))) ? ~(word)0 : 0;
}